

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

int __thiscall
glslang::HlslParseContext::flatten
          (HlslParseContext *this,TVariable *variable,TType *type,TFlattenData *flattenData,
          TString *name,bool linkage,TQualifier *outerQualifier,TArraySizes *builtInArraySizes)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  iVar1 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar1 == '\0') {
    iVar1 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar1 == '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0x4d0,
                    "int glslang::HlslParseContext::flatten(const TVariable &, const TType &, TFlattenData &, TString, bool, const TQualifier &, const TArraySizes *)"
                   );
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(&local_80,name);
    iVar1 = flattenStruct(this,variable,type,flattenData,&local_80,linkage,outerQualifier,
                          builtInArraySizes);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(&local_58,name);
    iVar1 = flattenArray(this,variable,type,flattenData,&local_58,linkage,outerQualifier);
  }
  return iVar1;
}

Assistant:

int HlslParseContext::flatten(const TVariable& variable, const TType& type,
                              TFlattenData& flattenData, TString name, bool linkage,
                              const TQualifier& outerQualifier,
                              const TArraySizes* builtInArraySizes)
{
    // If something is an arrayed struct, the array flattener will recursively call flatten()
    // to then flatten the struct, so this is an "if else": we don't do both.
    if (type.isArray())
        return flattenArray(variable, type, flattenData, name, linkage, outerQualifier);
    else if (type.isStruct())
        return flattenStruct(variable, type, flattenData, name, linkage, outerQualifier, builtInArraySizes);
    else {
        assert(0); // should never happen
        return -1;
    }
}